

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas_lite.c
# Opt level: O3

doublereal sdot_(integer *n,real *sx,integer *incx,real *sy,integer *incy)

{
  int iVar1;
  uint uVar2;
  float *pfVar3;
  uint uVar4;
  float *pfVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  float fVar9;
  
  uVar2 = *n;
  if ((int)uVar2 < 1) {
    return 0.0;
  }
  iVar1 = *incx;
  if ((long)iVar1 == 1) {
    iVar8 = *incy;
    uVar6 = 1;
    if (iVar8 == 1) {
      uVar4 = uVar2 % 5;
      if (uVar4 == 0) {
        fVar9 = 0.0;
      }
      else {
        fVar9 = 0.0;
        uVar6 = 0;
        do {
          fVar9 = fVar9 + sx[uVar6] * sy[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar2 % 5 != uVar6);
        if ((int)uVar2 < 5) goto LAB_0011eefc;
      }
      if ((int)uVar4 < (int)uVar2) {
        uVar4 = uVar4 + 1;
        lVar7 = 0;
        do {
          fVar9 = sx[(ulong)uVar4 + lVar7 + 3] * sy[(ulong)uVar4 + lVar7 + 3] +
                  sx[(ulong)uVar4 + lVar7 + 2] * sy[(ulong)uVar4 + lVar7 + 2] +
                  sx[(ulong)uVar4 + lVar7 + 1] * sy[(ulong)uVar4 + lVar7 + 1] +
                  sx[(ulong)uVar4 + lVar7] * sy[(ulong)uVar4 + lVar7] +
                  sx[(ulong)uVar4 + lVar7 + -1] * sy[(ulong)uVar4 + lVar7 + -1] + fVar9;
          lVar7 = lVar7 + 5;
        } while ((int)(uVar4 + (int)lVar7) <= (int)uVar2);
      }
      goto LAB_0011eefc;
    }
  }
  else {
    uVar6 = (ulong)((1 - uVar2) * iVar1 + 1);
    if (-1 < iVar1) {
      uVar6 = 1;
    }
    iVar8 = *incy;
  }
  uVar4 = (1 - uVar2) * iVar8 + 1;
  if (-1 < iVar8) {
    uVar4 = 1;
  }
  pfVar3 = sy + ((ulong)uVar4 - 1);
  pfVar5 = sx + (uVar6 - 1);
  fVar9 = 0.0;
  do {
    fVar9 = fVar9 + *pfVar5 * *pfVar3;
    pfVar3 = pfVar3 + iVar8;
    pfVar5 = pfVar5 + iVar1;
    uVar2 = uVar2 - 1;
  } while (uVar2 != 0);
LAB_0011eefc:
  return (double)fVar9;
}

Assistant:

doublereal sdot_(integer *n, real *sx, integer *incx, real *sy, integer *incy)
{
    /* System generated locals */
    integer i__1;
    real ret_val;

    /* Local variables */
    static integer i__, m, ix, iy, mp1;
    static real stemp;


/*
       forms the dot product of two vectors.
       uses unrolled loops for increments equal to one.
       jack dongarra, linpack, 3/11/78.
       modified 12/3/93, array(1) declarations changed to array(*)
*/


    /* Parameter adjustments */
    --sy;
    --sx;

    /* Function Body */
    stemp = 0.f;
    ret_val = 0.f;
    if (*n <= 0) {
	return ret_val;
    }
    if (*incx == 1 && *incy == 1) {
	goto L20;
    }

/*
          code for unequal increments or equal increments
            not equal to 1
*/

    ix = 1;
    iy = 1;
    if (*incx < 0) {
	ix = (-(*n) + 1) * *incx + 1;
    }
    if (*incy < 0) {
	iy = (-(*n) + 1) * *incy + 1;
    }
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	stemp += sx[ix] * sy[iy];
	ix += *incx;
	iy += *incy;
/* L10: */
    }
    ret_val = stemp;
    return ret_val;

/*
          code for both increments equal to 1


          clean-up loop
*/

L20:
    m = *n % 5;
    if (m == 0) {
	goto L40;
    }
    i__1 = m;
    for (i__ = 1; i__ <= i__1; ++i__) {
	stemp += sx[i__] * sy[i__];
/* L30: */
    }
    if (*n < 5) {
	goto L60;
    }
L40:
    mp1 = m + 1;
    i__1 = *n;
    for (i__ = mp1; i__ <= i__1; i__ += 5) {
	stemp = stemp + sx[i__] * sy[i__] + sx[i__ + 1] * sy[i__ + 1] + sx[
		i__ + 2] * sy[i__ + 2] + sx[i__ + 3] * sy[i__ + 3] + sx[i__ +
		4] * sy[i__ + 4];
/* L50: */
    }
L60:
    ret_val = stemp;
    return ret_val;
}